

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
gmlc::utilities::base64_decode
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          utilities *this,string_view encoded_string,size_t offset)

{
  pointer *ppuVar1;
  utilities uVar2;
  byte bVar3;
  byte bVar4;
  undefined4 uVar5;
  ulong uVar6;
  long lVar7;
  iterator iVar8;
  utilities *puVar9;
  utilities *puVar10;
  byte *__args;
  uint uVar11;
  ulong uVar12;
  array<unsigned_char,_3UL> char_array_3;
  array<unsigned_char,_4UL> char_array_4;
  byte local_40 [4];
  undefined4 local_3c;
  size_t local_38;
  
  local_38 = encoded_string._M_len;
  puVar9 = this + ~(ulong)encoded_string._M_str;
  local_40[2] = 0;
  local_40[0] = 0;
  local_40[1] = 0;
  local_3c = 0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (__return_storage_ptr__,(ulong)((long)puVar9 * 4) / 3 + 2);
  if (puVar9 != (utilities *)0x0) {
    local_38 = local_38 + (long)(int)encoded_string._M_str;
    puVar10 = (utilities *)0x0;
    __args = local_40;
    uVar11 = 0;
    do {
      uVar2 = puVar10[local_38];
      if (((ulong)(byte)uVar2 == 0x3d) || ((&b64Map)[(byte)uVar2] == -1)) break;
      lVar7 = (long)(int)uVar11;
      uVar11 = uVar11 + 1;
      *(utilities *)((long)&local_3c + lVar7) = uVar2;
      uVar5 = local_3c;
      if (uVar11 == 4) {
        uVar12 = (ulong)(byte)local_3c;
        bVar3 = (&b64Map)[local_3c._1_1_];
        local_3c._2_1_ = SUB41(uVar5,2);
        bVar4 = (&b64Map)[local_3c._2_1_];
        local_3c._3_1_ = SUB41(uVar5,3);
        uVar6 = (ulong)local_3c._3_1_;
        local_3c = CONCAT13((&b64Map)[uVar6],CONCAT12(bVar4,CONCAT11(bVar3,(&b64Map)[uVar12])));
        local_40[0] = bVar3 >> 4 & 3 | (&b64Map)[uVar12] << 2;
        local_40[1] = bVar4 >> 2 & 0xf | bVar3 << 4;
        local_40[2] = bVar4 * '@' + (&b64Map)[uVar6];
        iVar8._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     iVar8,__args);
          iVar8._M_current =
               (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
        }
        else {
          *iVar8._M_current = local_40[0];
          iVar8._M_current =
               (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish + 1;
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar8._M_current;
        }
        if (iVar8._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     iVar8,(uchar *)((long)local_40 + 1));
          iVar8._M_current =
               (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
        }
        else {
          *iVar8._M_current = local_40[1];
          iVar8._M_current =
               (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish + 1;
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar8._M_current;
        }
        if (iVar8._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          uVar11 = 0;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                     iVar8,local_40 + 2);
        }
        else {
          *iVar8._M_current = local_40[2];
          ppuVar1 = &(__return_storage_ptr__->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
          uVar11 = 0;
        }
      }
      puVar10 = puVar10 + 1;
    } while (puVar9 != puVar10);
    if (0 < (int)uVar11) {
      if (uVar11 < 4) {
        memset((void *)((long)&local_3c + (ulong)uVar11),0,(ulong)(4 - uVar11));
      }
      local_40[1] = (byte)(&b64Map)[local_3c._2_1_] >> 2 & 0xf | (&b64Map)[local_3c._1_1_] << 4;
      local_40[0] = (byte)(&b64Map)[local_3c._1_1_] >> 4 & 3 | (&b64Map)[(byte)local_3c] << 2;
      local_40[2] = (&b64Map)[local_3c._2_1_] * '@' + (&b64Map)[local_3c._3_1_];
      if (uVar11 != 1) {
        uVar12 = (ulong)(uVar11 - 1);
        do {
          iVar8._M_current =
               (__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar8._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__
                       ,iVar8,__args);
          }
          else {
            *iVar8._M_current = *__args;
            ppuVar1 = &(__return_storage_ptr__->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          __args = __args + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char>
    base64_decode(std::string_view encoded_string, size_t offset)
{
    auto in_len = encoded_string.size() - offset - 1;
    int indexOut = 0;
    int indexIn = static_cast<int>(offset);
    std::array<unsigned char, 3> char_array_3{{0U, 0U, 0U}};
    std::array<unsigned char, 4> char_array_4{{0U, 0U, 0U, 0U}};
    std::vector<unsigned char> ret;
    ret.reserve((in_len * 4) / 3 + 2);

    while (((in_len--) != 0U) && (encoded_string[indexIn] != '=') &&
           isBase64(encoded_string[indexIn])) {
        char_array_4[indexOut++] = encoded_string[indexIn];
        indexIn++;
        if (indexOut == 4) {
            char_array_4[0] = b64Map[char_array_4[0]];
            char_array_4[1] = b64Map[char_array_4[1]];
            char_array_4[2] = b64Map[char_array_4[2]];
            char_array_4[3] = b64Map[char_array_4[3]];

            char_array_3[0] =
                (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
            char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
                ((char_array_4[2] & 0x3cU) >> 2U);
            char_array_3[2] =
                ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];

            ret.push_back(char_array_3[0]);
            ret.push_back(char_array_3[1]);
            ret.push_back(char_array_3[2]);

            indexOut = 0;
        }
    }

    if (indexOut > 0) {
        for (int j = indexOut; j < 4; j++) {
            char_array_4[j] = 0;
        }
        char_array_4[0] = b64Map[char_array_4[0]];
        char_array_4[1] = b64Map[char_array_4[1]];
        char_array_4[2] = b64Map[char_array_4[2]];
        char_array_4[3] = b64Map[char_array_4[3]];

        char_array_3[0] =
            (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
        char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
            ((char_array_4[2] & 0x3cU) >> 2U);
        char_array_3[2] = ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];

        for (int j = 0; (j < indexOut - 1); j++) {
            ret.push_back(char_array_3[j]);
        }
    }

    return ret;
}